

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::Delaunay3dThread::check_geometry(Delaunay3dThread *this,bool verbose)

{
  uint uVar1;
  uint uVar2;
  pointer piVar3;
  index_t t;
  bool bVar4;
  ostream *poVar5;
  index_t v;
  ulong uVar6;
  undefined7 in_register_00000031;
  bool bVar7;
  ulong uVar8;
  allocator local_86;
  allocator local_85;
  undefined4 local_84;
  ulong local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_84 = (undefined4)CONCAT71(in_register_00000031,verbose);
  bVar7 = true;
  for (uVar8 = 0; uVar8 < this->max_t_; uVar8 = uVar8 + 1) {
    if ((this->cell_next_->
        super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>).
        super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] == 0xfffffffe) {
      t = (index_t)uVar8;
      uVar6 = (ulong)(t * 4);
      piVar3 = (this->cell_to_v_store_->super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>)
               .super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78 = (ulong)(uint)piVar3[uVar6];
      local_80 = (ulong)(uint)piVar3[uVar6 + 1];
      uVar1 = piVar3[uVar6 + 2];
      uVar2 = piVar3[uVar6 + 3];
      for (uVar6 = 0; uVar6 < this->nb_vertices_; uVar6 = uVar6 + 1) {
        if ((((uVar2 != uVar6) && (uVar1 != uVar6)) && (local_78 != uVar6)) && (local_80 != uVar6))
        {
          bVar4 = tet_is_in_conflict(this,t,this->vertices_ + this->vertex_stride_ * (int)uVar6);
          if ((bVar4 & (byte)local_84) == 1) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"Tet ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," is in conflict with vertex ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::endl<char,std::char_traits<char>>(poVar5);
            std::operator<<((ostream *)&std::cerr,"  offending tet: ");
            show_tet(this,t);
            bVar7 = false;
          }
          else {
            bVar7 = (bool)(bVar7 & !bVar4);
          }
        }
      }
    }
  }
  if (bVar7) {
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    poVar5 = std::operator<<(poVar5,"Delaunay Geo OK");
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  std::__cxx11::string::string((string *)&local_50,"ok",&local_85);
  std::__cxx11::string::string
            ((string *)&local_70,
             "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
             ,&local_86);
  geo_assertion_failed(&local_50,&local_70,0x685e);
}

Assistant:

void check_geometry(bool verbose) const {
            bool ok = true;
            for(index_t t = 0; t < max_t(); ++t) {
                if(!tet_is_free(t)) {
                    signed_index_t v0 = tet_vertex(t, 0);
                    signed_index_t v1 = tet_vertex(t, 1);
                    signed_index_t v2 = tet_vertex(t, 2);
                    signed_index_t v3 = tet_vertex(t, 3);
                    for(index_t v = 0; v < nb_vertices(); ++v) {
                        signed_index_t sv = signed_index_t(v);
                        if(sv == v0 || sv == v1 || sv == v2 || sv == v3) {
                            continue;
                        }
                        if(tet_is_in_conflict(t, vertex_ptr(v))) {
                            ok = false;
                            if(verbose) {
                                std::cerr << "Tet " << t <<
                                    " is in conflict with vertex " << v
                                          << std::endl;
                                
                                std::cerr << "  offending tet: ";
                                show_tet(t);
                            }
                        }
                    }
                }
            }
            geo_assert(ok);
            std::cerr << std::endl << "Delaunay Geo OK" << std::endl;
        }